

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O0

void __thiscall ON_PostEffect::ON_PostEffect(ON_PostEffect *this,ON_PostEffect *pep)

{
  Types t;
  CImpl *this_00;
  wchar_t *n;
  undefined4 extraout_var;
  ON_UUID local_3c;
  ON_wString local_20;
  ON_PostEffect *local_18;
  ON_PostEffect *pep_local;
  ON_PostEffect *this_local;
  
  this->_vptr_ON_PostEffect = (_func_int **)&PTR__ON_PostEffect_00b77510;
  local_18 = pep;
  pep_local = this;
  this_00 = (CImpl *)operator_new(0x30);
  (*local_18->_vptr_ON_PostEffect[7])(&local_20);
  n = ON_wString::operator_cast_to_wchar_t_(&local_20);
  local_3c.Data1 = (*local_18->_vptr_ON_PostEffect[6])();
  local_3c._4_4_ = extraout_var;
  t = (*local_18->_vptr_ON_PostEffect[5])();
  CImpl::CImpl(this_00,(ON_PostEffects *)0x0,n,&local_3c,t);
  this->_impl = this_00;
  ON_wString::~ON_wString(&local_20);
  (*this->_vptr_ON_PostEffect[2])(this,local_18);
  return;
}

Assistant:

ON_PostEffect::ON_PostEffect(const ON_PostEffect& pep)
{
  _impl = new CImpl(nullptr, pep.LocalName(), pep.Id(), pep.Type());
  operator = (pep);
}